

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
delta_complex_cell_t::delta_complex_cell_t
          (delta_complex_cell_t *this,vector<long,_std::allocator<long>_> *_vertices,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *_orientation,value_t _filt,index_t _loc,index_t _cli_loc)

{
  index_t _cli_loc_local;
  index_t _loc_local;
  value_t _filt_local;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *_orientation_local;
  vector<long,_std::allocator<long>_> *_vertices_local;
  delta_complex_cell_t *this_local;
  
  std::vector<long,_std::allocator<long>_>::vector(&this->coboundary);
  std::vector<long,_std::allocator<long>_>::vector(&this->boundary);
  std::vector<long,_std::allocator<long>_>::vector(&this->vertices,_vertices);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&this->orientation,_orientation);
  this->location = _loc;
  this->cli_loc = _cli_loc;
  this->filt = _filt;
  this->oldest_coface = -1;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&this->neighbours);
  std::
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  ::unordered_map(&this->in_or_out);
  return;
}

Assistant:

delta_complex_cell_t(std::vector<index_t> _vertices, std::vector<std::vector<index_t>> _orientation, value_t _filt, index_t _loc, index_t _cli_loc) : filt(_filt),
						oldest_coface(-1), orientation(_orientation), vertices(_vertices), location(_loc), cli_loc(_cli_loc) {}